

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Vec_Ptr_t * Aig_ManMiterPartitioned(Aig_Man_t *p1,Aig_Man_t *p2,int nPartSize,int fSmart)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *vPart;
  Vec_Int_t *vSuppMap;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Aig_Man_t *p;
  Vec_Ptr_t *vNodes2;
  Aig_Obj_t *pDriver;
  int iVar7;
  int iVar8;
  long lVar9;
  Vec_Ptr_t *vPartSupps;
  Vec_Ptr_t *local_50;
  Aig_Man_t *local_48;
  Vec_Ptr_t *local_40;
  Aig_Man_t *local_38;
  
  local_38 = p2;
  if (fSmart == 0) {
    pVVar4 = Aig_ManPartitionNaive(p1,nPartSize);
    local_50 = Aig_ManSupportNodes(p1,pVVar4);
  }
  else {
    pVVar4 = Aig_ManPartitionSmart(p1,nPartSize,0,&local_50);
  }
  iVar8 = pVVar4->nSize;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar8 - 1U) {
    iVar7 = iVar8;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar5->pArray = ppvVar6;
  if (0 < pVVar4->nSize) {
    lVar9 = 0;
    local_48 = p1;
    local_40 = pVVar4;
    do {
      if (local_50->nSize <= lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      vPart = (Vec_Int_t *)local_40->pArray[lVar9];
      vSuppMap = (Vec_Int_t *)local_50->pArray[lVar9];
      p = Aig_ManStart(1000);
      if (0 < vSuppMap->nSize) {
        iVar8 = 0;
        do {
          Aig_ObjCreateCi(p);
          iVar8 = iVar8 + 1;
        } while (iVar8 < vSuppMap->nSize);
      }
      pVVar4 = Aig_ManDupPart(p,local_48,vPart,vSuppMap,0);
      vNodes2 = Aig_ManDupPart(p,local_38,vPart,vSuppMap,0);
      pDriver = Aig_MiterTwo(p,pVVar4,vNodes2);
      if (pVVar4->pArray != (void **)0x0) {
        free(pVVar4->pArray);
        pVVar4->pArray = (void **)0x0;
      }
      if (pVVar4 != (Vec_Ptr_t *)0x0) {
        free(pVVar4);
      }
      if (vNodes2->pArray != (void **)0x0) {
        free(vNodes2->pArray);
        vNodes2->pArray = (void **)0x0;
      }
      if (vNodes2 != (Vec_Ptr_t *)0x0) {
        free(vNodes2);
      }
      Aig_ObjCreateCo(p,pDriver);
      Aig_ManCleanup(p);
      uVar1 = pVVar5->nSize;
      uVar2 = pVVar5->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_0060770b;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar5->pArray = ppvVar6;
        pVVar5->nCap = iVar8;
      }
LAB_0060770b:
      pVVar4 = local_40;
      pVVar5->nSize = uVar1 + 1;
      pVVar5->pArray[(int)uVar1] = p;
      lVar9 = lVar9 + 1;
    } while (lVar9 < local_40->nSize);
    if (0 < local_40->nSize) {
      lVar9 = 0;
      do {
        pvVar3 = pVVar4->pArray[lVar9];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
            *(undefined8 *)((long)pvVar3 + 8) = 0;
          }
          free(pvVar3);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar4->nSize);
    }
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = local_50;
  if (0 < local_50->nSize) {
    lVar9 = 0;
    do {
      pvVar3 = pVVar4->pArray[lVar9];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar4->nSize);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Aig_ManMiterPartitioned( Aig_Man_t * p1, Aig_Man_t * p2, int nPartSize, int fSmart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pMiter;
    Vec_Ptr_t * vMiters, * vNodes1, * vNodes2;
    Vec_Ptr_t * vParts, * vPartSupps;
    Vec_Int_t * vPart, * vPartSupp;
    int i, k;
    // partition the first manager
    if ( fSmart )
        vParts = Aig_ManPartitionSmart( p1, nPartSize, 0, &vPartSupps );
    else
    {
        vParts = Aig_ManPartitionNaive( p1, nPartSize );
        vPartSupps = Aig_ManSupportNodes( p1, vParts );
    }
    // derive miters
    vMiters = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    for ( i = 0; i < Vec_PtrSize(vParts); i++ )
    {
        // get partition and its support
        vPart     = (Vec_Int_t *)Vec_PtrEntry( vParts, i );
        vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSupps, i );
        // create the new miter
        pNew = Aig_ManStart( 1000 );
        // create the PIs
        for ( k = 0; k < Vec_IntSize(vPartSupp); k++ )
            Aig_ObjCreateCi( pNew );
        // copy the components
        vNodes1 = Aig_ManDupPart( pNew, p1, vPart, vPartSupp, 0 );
        vNodes2 = Aig_ManDupPart( pNew, p2, vPart, vPartSupp, 0 );
        // create the miter
        pMiter = Aig_MiterTwo( pNew, vNodes1, vNodes2 );
        Vec_PtrFree( vNodes1 );
        Vec_PtrFree( vNodes2 );
        // create the output
        Aig_ObjCreateCo( pNew, pMiter );
        // clean up
        Aig_ManCleanup( pNew );
        Vec_PtrPush( vMiters, pNew );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_VecFree( (Vec_Vec_t *)vPartSupps );
    return vMiters;
}